

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm2d_test.cc
# Opt level: O0

string * (anonymous_namespace)::gtest_CAV1FwdTxfm2d_EvalGenerateName__abi_cxx11_
                   (TestParamInfo<std::tuple<unsigned_char,_unsigned_char,_double,_double>_> *info)

{
  bool bVar1;
  string *in_RDI;
  tuple<testing::internal::ParamGenerator<std::tuple<unsigned_char,_unsigned_char,_double,_double>_>_>
  t;
  ParamGenerator<std::tuple<unsigned_char,_unsigned_char,_double,_double>_>
  *in_stack_ffffffffffffff88;
  vector<std::tuple<unsigned_char,_unsigned_char,_double,_double>,_std::allocator<std::tuple<unsigned_char,_unsigned_char,_double,_double>_>_>
  *in_stack_ffffffffffffffa8;
  TestParamInfo<std::tuple<unsigned_char,_unsigned_char,_double,_double>_>
  *in_stack_ffffffffffffffb8;
  
  bVar1 = testing::internal::AlwaysFalse();
  if (bVar1) {
    testing::internal::
    TestNotEmpty<std::__cxx11::string(testing::TestParamInfo<std::tuple<unsigned_char,unsigned_char,double,double>>const&)>
              (testing::internal::
               DefaultParamName<std::tuple<unsigned_char,unsigned_char,double,double>>);
    anon_unknown.dwarf_ec30ed::GetTxfm2dParamList();
    testing::
    ValuesIn<std::vector<std::tuple<unsigned_char,unsigned_char,double,double>,std::allocator<std::tuple<unsigned_char,unsigned_char,double,double>>>>
              (in_stack_ffffffffffffffa8);
    std::
    make_tuple<testing::internal::ParamGenerator<std::tuple<unsigned_char,unsigned_char,double,double>>>
              (in_stack_ffffffffffffff88);
    testing::internal::ParamGenerator<std::tuple<unsigned_char,_unsigned_char,_double,_double>_>::
    ~ParamGenerator((ParamGenerator<std::tuple<unsigned_char,_unsigned_char,_double,_double>_> *)
                    0x9bf020);
    std::
    vector<std::tuple<unsigned_char,_unsigned_char,_double,_double>,_std::allocator<std::tuple<unsigned_char,_unsigned_char,_double,_double>_>_>
    ::~vector((vector<std::tuple<unsigned_char,_unsigned_char,_double,_double>,_std::allocator<std::tuple<unsigned_char,_unsigned_char,_double,_double>_>_>
               *)in_RDI);
    std::
    tuple<testing::internal::ParamGenerator<std::tuple<unsigned_char,_unsigned_char,_double,_double>_>_>
    ::~tuple((tuple<testing::internal::ParamGenerator<std::tuple<unsigned_char,_unsigned_char,_double,_double>_>_>
              *)0x9bf034);
  }
  testing::internal::DefaultParamName<std::tuple<unsigned_char,unsigned_char,double,double>>
            (in_stack_ffffffffffffffb8);
  return in_RDI;
}

Assistant:

TEST_P(AV1FwdTxfm2d, RunFwdAccuracyCheck) { RunFwdAccuracyCheck(); }